

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r3d.hpp
# Opt level: O2

void r3d::ClipHelper<2>::finalize_links(Int onv,Polytope<2> *poly)

{
  long lVar1;
  int iVar2;
  Int vstart;
  
  for (lVar1 = (long)onv; lVar1 < poly->nverts; lVar1 = lVar1 + 1) {
    if (poly->verts[lVar1].pnbrs[1] < 0) {
      iVar2 = poly->verts[lVar1].pnbrs[0];
      do {
        iVar2 = poly->verts[iVar2].pnbrs[0];
      } while (iVar2 < onv);
      poly->verts[lVar1].pnbrs[1] = iVar2;
      poly->verts[iVar2].pnbrs[0] = (Int)lVar1;
    }
  }
  return;
}

Assistant:

R3D_INLINE static void finalize_links(Int onv, Polytope<2>& poly) {
    for (auto vstart = onv; vstart < poly.nverts; ++vstart) {
      if (poly.verts[vstart].pnbrs[1] >= 0) continue;
      auto vcur = poly.verts[vstart].pnbrs[0];
      do {
        vcur = poly.verts[vcur].pnbrs[0];
      } while (vcur < onv);
      poly.verts[vstart].pnbrs[1] = vcur;
      poly.verts[vcur].pnbrs[0] = vstart;
    }
  }